

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colony.cpp
# Opt level: O1

void __thiscall Colony::move_ants(Colony *this)

{
  undefined1 (*pauVar1) [16];
  bool *pbVar2;
  int *piVar3;
  Node *pNVar4;
  Car *pCVar5;
  double dVar6;
  Node a;
  pair<int,_int> pVar7;
  pair<int,_int> pVar8;
  pair<int,_int> *ppVar9;
  pair<int,_int> pVar10;
  bool bVar11;
  int iVar12;
  long lVar13;
  Node *pNVar14;
  int iVar15;
  Colony *this_00;
  long lVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  undefined1 auVar21 [8];
  double **ppdVar22;
  double **ppdVar23;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> feasible_edges;
  vector<double,_std::allocator<double>_> cumulative_sum;
  vector<double,_std::allocator<double>_> probs;
  vector<double,_std::allocator<double>_> ups;
  double up;
  undefined1 local_128 [8];
  pair<int,_int> *ppStack_120;
  Car *local_118;
  Node *local_110;
  double **local_108;
  double **ppdStack_100;
  double **local_f8;
  int local_ec;
  undefined1 local_e8 [8];
  double *pdStack_e0;
  Car *local_d8;
  undefined1 local_c8 [8];
  double **ppdStack_c0;
  Car *local_b8;
  undefined1 local_a8 [8];
  pair<int,_int> pStack_a0;
  pair<int,_int> local_98;
  Node *local_88;
  int local_7c;
  double **local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_f8 = (double **)0x0;
  do {
    bVar11 = Graph::is_all_visited(&this->super_Graph);
    if (bVar11) break;
    this_00 = (Colony *)(this->super_Graph).cars;
    lVar13 = (long)(int)local_f8;
    lVar18 = lVar13 * 0x30;
    if (*(long *)((long)&this_00->super_Graph + lVar18 + 0x18) ==
        *(long *)((long)&this_00->super_Graph + lVar18 + 0x20)) {
      this_00 = (Colony *)((long)&this_00->super_Graph + lVar18);
      Car::add_node((Car *)this_00,(this->super_Graph).nodes,(this->super_Graph).distance_matrix);
    }
    local_128 = (undefined1  [8])0x0;
    ppStack_120 = (pair<int,_int> *)0x0;
    local_118 = (Car *)0x0;
    while (local_128 == (undefined1  [8])ppStack_120) {
      if (0x4b0 < (this->super_Graph).cars[lVar13].now_time) {
        if (local_128 == (undefined1  [8])ppStack_120) {
          uVar19 = (int)local_f8 + 1;
          if ((int)uVar19 < (this->super_Graph).num_car) {
            pCVar5 = (this->super_Graph).cars;
            bVar11 = true;
            if (pCVar5[lVar13].now_idx == 0) {
              local_f8 = (double **)(ulong)uVar19;
            }
            else {
              Car::add_node(pCVar5 + lVar13,(this->super_Graph).nodes,
                            (this->super_Graph).distance_matrix);
              local_f8 = (double **)(ulong)uVar19;
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"cannot visit all customers this step.",0x25);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
            std::ostream::put('\x10');
            std::ostream::flush();
            bVar11 = false;
          }
          goto LAB_00104ebd;
        }
        break;
      }
      if (1 < (this->super_Graph).num_node) {
        lVar20 = 1;
        lVar16 = 0;
        lVar18 = 0x100000000;
        do {
          pNVar4 = (this->super_Graph).nodes;
          if ((&pNVar4[1].visited)[lVar16] == false) {
            pNVar14 = (Node *)((long)&pNVar4[1].x + lVar16);
            this_00 = (Colony *)((this->super_Graph).cars + lVar13);
            local_58._0_4_ = pNVar14->x;
            local_58._4_4_ = pNVar14->y;
            uStack_50 = *(undefined8 *)((long)&pNVar4[1].idx + lVar16);
            local_48 = *(undefined8 *)(&pNVar4[1].visited + lVar16);
            uStack_40 = *(undefined8 *)((long)&pNVar4[1].tw_close + lVar16);
            bVar11 = Car::ok_capacity((Car *)this_00,*pNVar14);
            if (bVar11) {
              this_00 = (Colony *)((this->super_Graph).cars + lVar13);
              pNVar4 = (this->super_Graph).nodes;
              pauVar1 = (undefined1 (*) [16])((long)&pNVar4[1].x + lVar16);
              local_78 = *(double ***)*pauVar1;
              uStack_70 = *(undefined8 *)(*pauVar1 + 8);
              pbVar2 = &pNVar4[1].visited + lVar16;
              local_68 = *(undefined8 *)pbVar2;
              uStack_60 = *(undefined8 *)(pbVar2 + 8);
              a.visited = (bool)(char)local_68;
              a._17_3_ = (int3)((ulong)local_68 >> 8);
              a.tw_open = (int)((ulong)local_68 >> 0x20);
              a._0_16_ = *pauVar1;
              a.tw_close = (int)uStack_60;
              a.unload_time = (int)((ulong)uStack_60 >> 0x20);
              bVar11 = Car::ok_time((Car *)this_00,a,(this->super_Graph).distance_matrix);
              if (bVar11) {
                local_a8 = (undefined1  [8])
                           ((ulong)(uint)(this->super_Graph).cars[lVar13].now_idx + lVar18);
                if ((Car *)ppStack_120 == local_118) {
                  this_00 = (Colony *)local_128;
                  std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                  _M_realloc_insert<std::pair<int,int>>
                            ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                             this_00,(iterator)ppStack_120,(pair<int,_int> *)local_a8);
                }
                else {
                  *ppStack_120 = (pair<int,_int>)local_a8;
                  ppStack_120 = ppStack_120 + 1;
                }
              }
            }
          }
          lVar20 = lVar20 + 1;
          lVar18 = lVar18 + 0x100000000;
          lVar16 = lVar16 + 0x20;
        } while (lVar20 < (this->super_Graph).num_node);
      }
      if (local_128 == (undefined1  [8])ppStack_120) {
        piVar3 = &(this->super_Graph).cars[lVar13].now_time;
        *piVar3 = *piVar3 + 0x1e;
      }
    }
    dVar6 = get_rand(this_00);
    ppVar9 = ppStack_120;
    if (threshold <= dVar6) {
      local_a8._0_4_ = 0;
      local_a8._4_4_ = 0;
      pStack_a0.first = 0;
      pStack_a0.second = 0;
      local_98.first = 0;
      local_98.second = 0;
      local_b8 = (Car *)0x0;
      local_c8 = (undefined1  [8])0x0;
      ppdStack_c0 = (double **)0x0;
      local_d8 = (Car *)0x0;
      local_e8 = (undefined1  [8])0x0;
      pdStack_e0 = (double *)0x0;
      if (local_128 == (undefined1  [8])ppStack_120) {
        local_108 = (double **)0x0;
        pVar7 = (pair<int,_int>)local_a8;
        pVar8 = pStack_a0;
        iVar12 = local_7c;
      }
      else {
        local_108 = (double **)0x0;
        auVar21 = local_128;
        do {
          iVar12 = ((pair<int,_int> *)auVar21)->first;
          iVar15 = ((pair<int,_int> *)auVar21)->second;
          local_110 = (Node *)pow(this->etha_matrix[iVar12][iVar15],5.0);
          dVar6 = pow(this->phero_matrix[iVar12][iVar15],3.0);
          local_110 = (Node *)(dVar6 * (double)local_110);
          local_88 = local_110;
          if (pStack_a0 == local_98) {
            this_00 = (Colony *)local_a8;
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)this_00,(iterator)pStack_a0,
                       (double *)&local_88);
          }
          else {
            *(Node **)pStack_a0 = local_110;
            pStack_a0 = (pair<int,_int>)((long)pStack_a0 + 8);
          }
          local_108 = (double **)((double)local_108 + (double)local_110);
          auVar21 = (undefined1  [8])((long)auVar21 + 8);
          pVar7 = (pair<int,_int>)local_a8;
          pVar8 = pStack_a0;
          iVar12 = local_7c;
        } while (auVar21 != (undefined1  [8])ppVar9);
      }
      for (; iVar15 = local_7c, pVar10 = pStack_a0, local_7c = iVar12, pVar7 != pStack_a0;
          pVar7 = (pair<int,_int>)((long)pVar7 + 8)) {
        local_88 = (Node *)(*(double *)pVar7 / (double)local_108);
        if ((Car *)ppdStack_c0 == local_b8) {
          this_00 = (Colony *)local_c8;
          pStack_a0 = pVar8;
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)this_00,(iterator)ppdStack_c0,
                     (double *)&local_88);
        }
        else {
          *ppdStack_c0 = (double *)local_88;
          ppdStack_c0 = (double **)((double *)ppdStack_c0 + 1);
          pStack_a0 = pVar8;
        }
        pVar8 = pStack_a0;
        iVar12 = local_7c;
        local_7c = iVar15;
        pStack_a0 = pVar10;
      }
      if ((Car *)pdStack_e0 == local_d8) {
        this_00 = (Colony *)local_e8;
        pStack_a0 = pVar8;
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)this_00,(iterator)pdStack_e0,
                   (double *)local_c8);
      }
      else {
        *pdStack_e0 = (double)*(double **)local_c8;
        pdStack_e0 = pdStack_e0 + 1;
        pStack_a0 = pVar8;
      }
      if ((long)ppdStack_c0 - (long)local_c8 != 8) {
        lVar18 = 8;
        uVar17 = 0;
        do {
          dVar6 = *(double *)((long)local_c8 + lVar18 + -8) + *(double *)((long)local_c8 + lVar18);
          *(double *)((long)local_c8 + lVar18) = dVar6;
          if ((Car *)pdStack_e0 == local_d8) {
            this_00 = (Colony *)local_e8;
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)this_00,(iterator)pdStack_e0,
                       (double *)((long)local_c8 + lVar18));
          }
          else {
            *pdStack_e0 = dVar6;
            pdStack_e0 = pdStack_e0 + 1;
          }
          uVar17 = uVar17 + 1;
          lVar18 = lVar18 + 8;
        } while (uVar17 < ((long)ppdStack_c0 - (long)local_c8 >> 3) - 1U);
      }
      local_108 = (double **)INFIN;
      ppdStack_100 = (double **)0x0;
      dVar6 = get_rand(this_00);
      if ((long)pdStack_e0 - (long)local_e8 != 0) {
        lVar18 = (long)pdStack_e0 - (long)local_e8 >> 3;
        lVar16 = 0;
        ppdVar22 = local_108;
        ppdVar23 = ppdStack_100;
        do {
          local_108 = *(double ***)((long)local_e8 + lVar16 * 8);
          ppdStack_100 = (double **)0x0;
          iVar12 = (int)lVar16;
          if ((double)local_108 < dVar6 || (double)ppdVar22 <= (double)local_108) {
            local_108 = ppdVar22;
            ppdStack_100 = ppdVar23;
            iVar12 = iVar15;
          }
          iVar15 = iVar12;
          lVar16 = lVar16 + 1;
          ppdVar22 = local_108;
          ppdVar23 = ppdStack_100;
        } while (lVar18 + (ulong)(lVar18 == 0) != lVar16);
      }
      local_110 = (Node *)INFIN;
      if (((double)local_108 != INFIN) || (NAN((double)local_108) || NAN(INFIN))) {
        local_ec = ((pair<int,_int> *)((long)local_128 + (long)iVar15 * 8))->second;
        iVar12 = 0;
      }
      else {
        iVar12 = 3;
      }
      local_7c = iVar15;
      if (local_e8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_e8);
      }
      if (local_c8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_c8);
      }
      if ((pair<int,_int>)local_a8 != (pair<int,_int>)0x0) {
        operator_delete((void *)local_a8);
      }
      if (((double)local_108 != (double)local_110) ||
         (NAN((double)local_108) || NAN((double)local_110))) goto LAB_00104e98;
    }
    else {
      iVar12 = rand();
      local_ec = ((pair<int,_int> *)
                 ((long)local_128 +
                 ((ulong)(long)iVar12 % (ulong)((long)ppStack_120 - (long)local_128 >> 3)) * 8))->
                 second;
LAB_00104e98:
      iVar12 = 0;
      Car::add_node((this->super_Graph).cars + lVar13,(this->super_Graph).nodes + local_ec,
                    (this->super_Graph).distance_matrix);
    }
    bVar11 = iVar12 == 0;
LAB_00104ebd:
    if (local_128 != (undefined1  [8])0x0) {
      operator_delete((void *)local_128);
    }
  } while (bVar11);
  pCVar5 = (this->super_Graph).cars;
  if (pCVar5[(int)local_f8].now_idx != 0) {
    Car::add_node(pCVar5 + (int)local_f8,(this->super_Graph).nodes,
                  (this->super_Graph).distance_matrix);
  }
  return;
}

Assistant:

void Colony::move_ants()
{
	int car_idx = 0;
	while(!is_all_visited()){
		if(cars[car_idx].tour.empty()){
			cars[car_idx].add_node(&nodes[0], distance_matrix);// nodes[0] denotes depot
		}
		std::vector< std::pair<int, int> > feasible_edges;
		feasible_edges.clear();
		while (feasible_edges.empty() && cars[car_idx].now_time <= 1200){
			for(int node_idx = 1; node_idx < num_node; node_idx++){
				if(!nodes[node_idx].visited){
					if(cars[car_idx].ok_capacity(nodes[node_idx])){
						if(cars[car_idx].ok_time(nodes[node_idx], distance_matrix)){
							feasible_edges.push_back(std::make_pair(cars[car_idx].now_idx, node_idx));
						}
					}
				}
			}
			if(feasible_edges.empty()){
				cars[car_idx].now_time += 30;// wait for the tw_open at the depot
			}
		}
		
		if(feasible_edges.empty()){// if still edges are not found, return depot
			if(car_idx + 1 < num_car){// check if the rest of vehicles exists
				if(cars[car_idx].now_idx != 0){// in case the vehicle did not return back to the depot
					cars[car_idx].add_node(&nodes[0], distance_matrix);
				}
				car_idx += 1;// assign next vehicle			
			}
			else{
				std::cout << "cannot visit all customers this step." << std::endl;
				break;
			}
		}
		else{
			int next_node_idx;
			if (get_rand() < threshold){// choose randomly next node, this prevents local optimization
				next_node_idx = feasible_edges[rand() % feasible_edges.size()].second;
			}
			else{// follow heuristc and pheromone formula, choose next node
				std::vector<double> ups, probs, cumulative_sum;
				double sum = 0.0;
				for (auto feasible_edge : feasible_edges){
					double up = calc_prob(feasible_edge.first, feasible_edge.second);
					sum += up;
					ups.push_back(up);
				}
				for (auto up : ups){
					probs.push_back(up / sum);
				}
				cumulative_sum.push_back(probs.front());
				for (int i = 0; i < probs.size() - 1; i ++){
					probs[i+1] += probs[i];
					cumulative_sum.push_back(probs[i+1]);
				}
				int candi_idx, best_idx;
				double candi_v;
				double best_v = INFIN;
				double r = get_rand();
				for (int x = 0; x < cumulative_sum.size(); x++){
					if (r <= cumulative_sum[x]){
						candi_idx = x;
						candi_v = cumulative_sum[x];
						if (candi_v < best_v){
							best_idx = candi_idx;
							best_v = candi_v;
						}
					}
				}
				if (best_v == INFIN){
						break;
				}
				next_node_idx = feasible_edges[best_idx].second;
				
				// search algorithm
				// double rand = get_rand();
				// // std::sort(cumulative_sum.begin(), cumulative_sum.end());
				// for (auto itr = cumulative_sum.begin(); itr != cumulative_sum.end(); itr++){
				// 	if (rand_num < *itr){
				// 		int next_node_idx = itr;
				// 		break;
				// 	}
				// }
				// auto iter = std::max_element(cumulative_sum.begin(), cumulative_sum.end());
				// next_node_idx = std::distance(cumulative_sum.begin(), iter);// https://teramonagi.hatenablog.com/entry/20130225/1361793892
			}
			cars[car_idx].add_node(&nodes[next_node_idx], distance_matrix);
		}
	}// while loop done
	if(cars[car_idx].now_idx != 0){// in case the vehicle did not return back to the depot
		cars[car_idx].add_node(&nodes[0], distance_matrix);
	}
}